

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O0

void __thiscall
qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
          (SquareMatrix<std::complex<double>_> *this,complex<double> m00,complex<double> m01,
          complex<double> m10,complex<double> m11)

{
  type pcVar1;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  SquareMatrix<std::complex<double>_> *this_local;
  complex<double> m11_local;
  complex<double> m10_local;
  complex<double> m01_local;
  complex<double> m00_local;
  
  this->size_ = 2;
  alloc_unique_array<std::complex<double>>((dense *)&this->data_,4);
  pcVar1 = std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
           operator[](&this->data_,0);
  *(undefined8 *)pcVar1->_M_value = in_XMM0_Qa;
  *(undefined8 *)(pcVar1->_M_value + 8) = in_XMM1_Qa;
  pcVar1 = std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
           operator[](&this->data_,1);
  *(undefined8 *)pcVar1->_M_value = in_XMM4_Qa;
  *(undefined8 *)(pcVar1->_M_value + 8) = in_XMM5_Qa;
  pcVar1 = std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
           operator[](&this->data_,2);
  *(undefined8 *)pcVar1->_M_value = in_XMM2_Qa;
  *(undefined8 *)(pcVar1->_M_value + 8) = in_XMM3_Qa;
  pcVar1 = std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
           operator[](&this->data_,3);
  *(undefined8 *)pcVar1->_M_value = in_XMM6_Qa;
  *(undefined8 *)(pcVar1->_M_value + 8) = in_XMM7_Qa;
  return;
}

Assistant:

SquareMatrix( const T m00 , const T m01 ,
                      const T m10 , const T m11 )
        : size_( 2 )
        , data_( alloc_unique_array< T >( 4 ) )
        {
          data_[0] = m00 ; data_[1] = m10 ;
          data_[2] = m01 ; data_[3] = m11 ;
        }